

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O3

uint32 re2::Engines(void)

{
  bool bVar1;
  uint32 uVar2;
  ostream *poVar3;
  Engine i;
  Engine EVar4;
  StringPiece SVar5;
  StringPiece local_1c0;
  LogMessage local_1b0;
  
  uVar2 = Engines::cached_engines;
  if (Engines()::did_parse != '\x01') {
    if (CONCAT44(uRam0000000000159444,DAT_00159440) == 0) {
      Engines::cached_engines = 0xffffffff;
    }
    else {
      EVar4 = kEngineBacktrack;
      do {
        local_1b0.severity_ = (int)FLAGS_regexp_engines_abi_cxx11_;
        local_1b0.flushed_ = FLAGS_regexp_engines_abi_cxx11_._4_1_;
        local_1b0._5_3_ = FLAGS_regexp_engines_abi_cxx11_._5_3_;
        local_1b0.str_ = DAT_00159440._0_1_;
        local_1b0._9_3_ = DAT_00159440._1_3_;
        SVar5 = EngineName(EVar4);
        bVar1 = StringPiece::contains((StringPiece *)&local_1b0,SVar5);
        if (bVar1) {
          Engines::cached_engines = Engines::cached_engines | 1 << ((byte)EVar4 & 0x1f);
        }
        EVar4 = EVar4 + kEngineNFA;
      } while (EVar4 != kEngineMax);
      if (Engines::cached_engines == 0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0x43,0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"Warning: no engines enabled.",0x1c);
        LogMessage::~LogMessage(&local_1b0);
      }
    }
    uVar2 = Engines::cached_engines & 0xfffffdff;
    EVar4 = kEngineBacktrack;
    Engines::cached_engines = uVar2;
    do {
      if ((uVar2 >> (EVar4 & 0x1f) & 1) != 0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0x48,0);
        SVar5 = EngineName(EVar4);
        local_1c0.ptr_ = SVar5.ptr_;
        local_1c0.length_ = SVar5.length_;
        poVar3 = operator<<((ostream *)&local_1b0.str_,&local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," enabled",8);
        LogMessage::~LogMessage(&local_1b0);
        uVar2 = Engines::cached_engines;
      }
      EVar4 = EVar4 + kEngineNFA;
    } while (EVar4 != kEngineMax);
    Engines()::did_parse = '\x01';
  }
  return uVar2;
}

Assistant:

static uint32 Engines() {
  static bool did_parse = false;
  static uint32 cached_engines = 0;

  if (did_parse)
    return cached_engines;

  if (FLAGS_regexp_engines.empty()) {
    cached_engines = ~0;
  } else {
    for (Engine i = static_cast<Engine>(0); i < kEngineMax; i++)
      if (StringPiece(FLAGS_regexp_engines).contains(EngineName(i)))
        cached_engines |= 1<<i;
  }

  if (cached_engines == 0)
    LOG(INFO) << "Warning: no engines enabled.";
  if (!UsingPCRE)
    cached_engines &= ~(1<<kEnginePCRE);
  for (Engine i = static_cast<Engine>(0); i < kEngineMax; i++) {
    if (cached_engines & (1<<i))
      LOG(INFO) << EngineName(i) << " enabled";
  }

  did_parse = true;
  return cached_engines;
}